

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

undefined8 cfd::api::json::PsbtScriptData::GetTypeString_abi_cxx11_(PsbtScriptData *obj)

{
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  
  core::ConvertToString<std::__cxx11::string>(in_stack_00000088);
  return in_RDI;
}

Assistant:

static std::string GetTypeString(  // line separate
      const PsbtScriptData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.type_);
  }